

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O3

string * __thiscall
JtagShiftedData::GetHexOrBinaryString_abi_cxx11_
          (string *__return_storage_ptr__,JtagShiftedData *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bits,DisplayBase display_base)

{
  pointer puVar1;
  ulong uVar2;
  ulonglong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  char number_str [128];
  char local_b8 [136];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar6 = (pointer)this->mStartSampleIndex;
  puVar1 = (this->mTdiBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar6 != puVar1) {
    uVar4 = (long)puVar1 - (long)puVar6;
    do {
      uVar5 = (ulong)((uint)uVar4 & 0x3f);
      if ((uVar4 & 0x3f) == 0) {
        uVar5 = 0x40;
      }
      uVar3 = 0;
      uVar2 = uVar5;
      do {
        uVar2 = uVar2 - 1;
        uVar3 = (ulong)(*puVar6 == '\x01') + uVar3 * 2;
        puVar6 = puVar6 + 1;
        if (puVar6 == puVar1) break;
      } while (uVar2 != 0);
      AnalyzerHelpers::GetNumberString(uVar3,(DisplayBase)bits,(uint)uVar5,local_b8,0x80);
      if (__return_storage_ptr__->_M_string_length == 0) {
        strlen(local_b8);
        std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)local_b8);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar4 = uVar4 - uVar5;
      puVar1 = (this->mTdiBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (puVar6 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JtagShiftedData::GetHexOrBinaryString( const std::vector<U8>& bits, DisplayBase display_base )
{
    std::string ret_val;
    std::vector<U8>::const_iterator bsi( bits.begin() );

    U64 val;
    size_t remain_bits = bits.size(), chunk_bits, bit_cnt;
    char number_str[ 128 ];
    while( bsi != bits.end() )
    {
        chunk_bits = remain_bits % 64;
        if( chunk_bits == 0 )
            chunk_bits = 64;

        // make a 64 bit value
        for( bit_cnt = chunk_bits, val = 0; bsi != bits.end() && bit_cnt > 0; ++bsi, --bit_cnt )
        {
            val = ( val << 1 ) | ( *bsi == BIT_HIGH ? 1 : 0 );
        }

        // make a string out of that value
        AnalyzerHelpers::GetNumberString( val, display_base, ( U32 )chunk_bits, number_str, sizeof( number_str ) );

        // concat the 64bit chunks but chop off all but the first 0x or 0b
        if( ret_val.empty() )
            ret_val = number_str;
        else
            ret_val += ( number_str + 2 );

        remain_bits -= chunk_bits;
    }

    return ret_val;
}